

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O1

size_t get_number_of_registered_devices(AMQP_TRANSPORT_INSTANCE *transport)

{
  LIST_ITEM_HANDLE item_handle;
  size_t sVar1;
  
  item_handle = singlylinkedlist_get_head_item(transport->registered_devices);
  sVar1 = 0;
  for (; item_handle != (LIST_ITEM_HANDLE)0x0;
      item_handle = singlylinkedlist_get_next_item(item_handle)) {
    sVar1 = sVar1 + 1;
  }
  return sVar1;
}

Assistant:

static size_t get_number_of_registered_devices(AMQP_TRANSPORT_INSTANCE* transport)
{
    size_t result = 0;

    LIST_ITEM_HANDLE list_item = singlylinkedlist_get_head_item(transport->registered_devices);

    while (list_item != NULL)
    {
        result++;
        list_item = singlylinkedlist_get_next_item(list_item);
    }

    return result;
}